

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_hash.hpp
# Opt level: O0

int __thiscall
pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::init
          (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  allocator_type *__a;
  uint in_ECX;
  undefined8 in_RDX;
  value_type *__value;
  size_type in_stack_ffffffffffffff88;
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffff90;
  value_type local_61 [4];
  undefined4 local_2c;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *local_28;
  
  local_2c = SUB84(ctx,0);
  (this->null).F_ab = in_ECX;
  (this->null).P_ab = (int)in_RDX;
  (this->null).L_ab = (int)((ulong)in_RDX >> 0x20);
  __a = (allocator_type *)((ulong)ctx & 0xffffffff);
  __value = local_61;
  local_28 = this;
  std::allocator<triple<unsigned_int>_>::allocator((allocator<triple<unsigned_int>_> *)0x12915e);
  std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>::vector
            ((vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__value,__a);
  std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>::
  allocator((allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_> *
            )0x12918a);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type *)__value,
           (allocator_type *)__a);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::operator=((vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
               *)__value,
              (vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
               *)__a);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
             *)__value);
  std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>::
  ~allocator((allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>
              *)0x1291cb);
  std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>::~vector
            ((vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_> *)__value);
  std::allocator<triple<unsigned_int>_>::~allocator((allocator<triple<unsigned_int>_> *)0x1291df);
  return extraout_EAX;
}

Assistant:

void init(itype max_alphabet_size, el_type null_el){

		this->null = null_el;

		H = vector<vector<el_type> >(max_alphabet_size,vector<el_type>(max_alphabet_size,null_el));

	}